

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall tli_window_manager::Text::Text(Text *this,Text *other)

{
  Text *other_local;
  Text *this_local;
  
  Observer::Observer(&this->super_Observer);
  Box::Box(&this->super_Box);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_position_00114ca8;
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00114ce8;
  std::__cxx11::string::string((string *)&this->buffer_,(string *)&other->buffer_);
  this->frame_width_ = other->frame_width_;
  this->frame_height_ = other->frame_height_;
  this->cursor_position_ = other->cursor_position_;
  this->index_ = other->index_;
  return;
}

Assistant:

Text::Text(const Text &other) : frame_width_{other.frame_width_}, frame_height_{other.frame_height_},
                                cursor_position_{other.cursor_position_}, index_{other.index_},
                                buffer_{other.buffer_} {}